

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckBuiltInVariable(uint32_t var_id,ValidationState_t *vstate)

{
  bool bVar1;
  Decoration DVar2;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this;
  spv_const_context psVar3;
  Instruction *inst;
  DiagnosticStream *pDVar4;
  string local_238;
  DiagnosticStream local_218;
  reference local_40;
  Decoration *d;
  iterator __end2;
  iterator __begin2;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range2;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *decorations;
  ValidationState_t *vstate_local;
  uint32_t var_id_local;
  
  vstate_local._0_4_ = var_id;
  this = ValidationState_t::id_decorations(vstate,var_id);
  __end2 = std::
           set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
           ::begin(this);
  d = (Decoration *)
      std::
      set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
      ::end(this);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&d);
    if (!bVar1) {
      return SPV_SUCCESS;
    }
    local_40 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end2);
    psVar3 = ValidationState_t::context(vstate);
    bVar1 = spvIsVulkanEnv(psVar3->target_env);
    if ((bVar1) &&
       ((DVar2 = Decoration::dec_type(local_40), DVar2 == DecorationLocation ||
        (DVar2 = Decoration::dec_type(local_40), DVar2 == Component)))) break;
    std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end2);
  }
  inst = ValidationState_t::FindDef(vstate,(uint32_t)vstate_local);
  ValidationState_t::diag(&local_218,vstate,SPV_ERROR_INVALID_ID,inst);
  ValidationState_t::VkErrorID_abi_cxx11_(&local_238,vstate,0x1333,(char *)0x0);
  pDVar4 = DiagnosticStream::operator<<(&local_218,&local_238);
  pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [24])"A BuiltIn variable (id ");
  pDVar4 = DiagnosticStream::operator<<(pDVar4,(uint *)&vstate_local);
  pDVar4 = DiagnosticStream::operator<<
                     (pDVar4,(char (*) [52])") cannot have any Location or Component decorations");
  vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
  std::__cxx11::string::~string((string *)&local_238);
  DiagnosticStream::~DiagnosticStream(&local_218);
  return vstate_local._4_4_;
}

Assistant:

spv_result_t CheckBuiltInVariable(uint32_t var_id, ValidationState_t& vstate) {
  const auto& decorations = vstate.id_decorations(var_id);
  for (const auto& d : decorations) {
    if (spvIsVulkanEnv(vstate.context()->target_env)) {
      if (d.dec_type() == spv::Decoration::Location ||
          d.dec_type() == spv::Decoration::Component) {
        return vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(var_id))
               << vstate.VkErrorID(4915) << "A BuiltIn variable (id " << var_id
               << ") cannot have any Location or Component decorations";
      }
    }
  }
  return SPV_SUCCESS;
}